

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O2

bilingual_str *
common::InvalidPortErrMsg
          (bilingual_str *__return_storage_ptr__,string *optname,string *invalid_value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  bilingual_str bStack_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  _(&bStack_68,(ConstevalStringLiteral)0xe391f9);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(tinyformat *)&bStack_68,(bilingual_str *)optname,invalid_value,
             in_R8);
  bilingual_str::~bilingual_str(&bStack_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str InvalidPortErrMsg(const std::string& optname, const std::string& invalid_value)
{
    return strprintf(_("Invalid port specified in %s: '%s'"), optname, invalid_value);
}